

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

size_t anon_unknown.dwarf_b82a1c::collectPathsForDebug
                 (string *buffer,cmSearchPath *searchPath,size_t startIndex)

{
  pointer pPVar1;
  size_t sVar2;
  pointer pPVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar3 = (searchPath->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (searchPath->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar3 == pPVar1) {
    std::__cxx11::string::append((char *)buffer);
    sVar2 = 0;
  }
  else {
    lVar4 = startIndex << 6;
    for (; sVar2 = (long)pPVar1 - (long)pPVar3 >> 6, startIndex < sVar2; startIndex = startIndex + 1
        ) {
      std::operator+(&local_70,"  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pPVar3->Path)._M_dataplus._M_p + lVar4));
      std::operator+(&local_50,&local_70,"\n");
      std::__cxx11::string::append((string *)buffer);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      pPVar3 = (searchPath->Paths).
               super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (searchPath->Paths).
               super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x40;
    }
  }
  return sVar2;
}

Assistant:

std::size_t collectPathsForDebug(std::string& buffer,
                                 cmSearchPath const& searchPath,
                                 std::size_t const startIndex = 0)
{
  const auto& paths = searchPath.GetPaths();
  if (paths.empty()) {
    buffer += "  none\n";
    return 0;
  }
  for (auto i = startIndex; i < paths.size(); i++) {
    buffer += "  " + paths[i].Path + "\n";
  }
  return paths.size();
}